

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_metrics.hpp
# Opt level: O0

ConfusionMatrix<int,_0> * __thiscall
notch::metrics::AClassifier<int,_0>::test
          (ConfusionMatrix<int,_0> *__return_storage_ptr__,AClassifier<int,_0> *this,
          LabeledDataset *testSet)

{
  bool bVar1;
  int predicted_00;
  int actual_00;
  LabeledData LVar2;
  int actual;
  int predicted;
  LabeledData sample;
  DatasetIterator __end3;
  undefined1 local_50 [8];
  DatasetIterator __begin3;
  LabeledDataset *__range3;
  LabeledDataset *testSet_local;
  AClassifier<int,_0> *this_local;
  ConfusionMatrix<int,_0> *cm;
  
  ConfusionMatrix<int,_0>::ConfusionMatrix(__return_storage_ptr__);
  __begin3.out_end._M_current = (valarray<float> *)testSet;
  core::LabeledDataset::begin((DatasetIterator *)local_50,testSet);
  core::LabeledDataset::end
            ((DatasetIterator *)&sample.label,(LabeledDataset *)__begin3.out_end._M_current);
  while (bVar1 = core::LabeledDataset::DatasetIterator::operator!=
                           ((DatasetIterator *)local_50,(DatasetIterator *)&sample.label), bVar1) {
    LVar2 = core::LabeledDataset::DatasetIterator::operator*((DatasetIterator *)local_50);
    _actual = LVar2.data;
    predicted_00 = (*this->_vptr_AClassifier[1])(this,_actual);
    sample.data = LVar2.label;
    actual_00 = (**this->_vptr_AClassifier)(this,sample.data);
    ConfusionMatrix<int,_0>::add(__return_storage_ptr__,actual_00,predicted_00);
    core::LabeledDataset::DatasetIterator::operator++((DatasetIterator *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual ConfusionMatrix<C, default_class> test(const LabeledDataset &testSet) {
		ConfusionMatrix<C, default_class> cm;
		for (LabeledData sample : testSet) {
			C predicted = classify(sample.data);
			C actual = aslabel(sample.label);
			cm.add(actual, predicted);
		}
		return cm;
	}